

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_staj_visitor<char>::dump
          (basic_staj_visitor<char> *this,basic_json_visitor<char> *visitor,ser_context *context,
          error_code *ec)

{
  bool bVar1;
  typed_array_type tVar2;
  typed_array_view *in_RSI;
  basic_staj_visitor<char> *in_RDI;
  size_t i_9;
  size_t i_8;
  size_t i_7;
  size_t i_6;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t len;
  typed_array_view *in_stack_fffffffffffffb20;
  typed_array_view *in_stack_fffffffffffffb38;
  typed_array_view *in_stack_fffffffffffffb40;
  ser_context *in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  semantic_tag tag;
  ser_context *this_00;
  span<const_double,_18446744073709551615UL> *in_stack_fffffffffffffb78;
  basic_json_visitor<char> *in_stack_fffffffffffffb80;
  basic_json_visitor<char> *this_01;
  error_code *in_stack_fffffffffffffbd8;
  ser_context *in_stack_fffffffffffffbe0;
  basic_json_visitor<char> *in_stack_fffffffffffffbe8;
  basic_staj_event<char> *in_stack_fffffffffffffbf0;
  undefined1 local_320 [32];
  ser_context local_300 [2];
  span<const_float,_18446744073709551615UL> local_2f0;
  undefined1 local_2e0 [32];
  ser_context local_2c0 [2];
  span<const_int,_18446744073709551615UL> local_2b0;
  ser_context local_2a0 [2];
  span<const_short,_18446744073709551615UL> local_290;
  ser_context local_280 [2];
  span<const_signed_char,_18446744073709551615UL> local_270;
  basic_json_visitor<char> local_260 [2];
  span<const_unsigned_long,_18446744073709551615UL> local_250;
  ser_context local_240 [2];
  span<const_unsigned_int,_18446744073709551615UL> local_230;
  ser_context local_220 [2];
  span<const_unsigned_short,_18446744073709551615UL> local_210;
  ser_context local_200 [2];
  span<const_unsigned_char,_18446744073709551615UL> local_1f0;
  ser_context local_1c8 [2];
  span<const_double,_18446744073709551615UL> local_1b8;
  ulong local_1a8;
  ser_context local_1a0 [2];
  span<const_float,_18446744073709551615UL> local_190;
  ulong local_180;
  ser_context local_178 [2];
  span<const_long,_18446744073709551615UL> local_168;
  ulong local_158;
  ser_context local_150 [2];
  span<const_int,_18446744073709551615UL> local_140;
  ulong local_130;
  ser_context local_128 [2];
  span<const_short,_18446744073709551615UL> local_118;
  ulong local_108;
  ser_context local_100 [2];
  span<const_signed_char,_18446744073709551615UL> local_f0;
  ulong local_e0;
  ser_context local_d8 [2];
  span<const_unsigned_long,_18446744073709551615UL> local_c8;
  ulong local_b8;
  ser_context local_b0 [2];
  span<const_unsigned_int,_18446744073709551615UL> local_a0;
  ulong local_90;
  ser_context local_88 [2];
  span<const_unsigned_short,_18446744073709551615UL> local_78;
  ulong local_68;
  ser_context local_50 [2];
  span<const_unsigned_char,_18446744073709551615UL> local_40;
  ulong local_30;
  size_t local_28;
  typed_array_view *local_10;
  
  local_10 = in_RSI;
  bVar1 = is_typed_array((basic_staj_visitor<char> *)0x2a2d2c);
  tag = (semantic_tag)((ulong)in_stack_fffffffffffffb70 >> 0x38);
  if (bVar1) {
    if (in_RDI->index_ == 0) {
      tVar2 = typed_array_view::type(&in_RDI->data_);
      switch(tVar2) {
      case uint8_value:
        local_1f0 = typed_array_view::data(&in_RDI->data_);
        local_200[0]._vptr_ser_context = (_func_int **)0x0;
        ser_context::ser_context(local_200);
        basic_json_visitor<char>::typed_array<unsigned_char_const>
                  (in_stack_fffffffffffffb80,
                   (span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffb78,
                   tag,in_stack_fffffffffffffb68);
        ser_context::~ser_context(local_200);
        break;
      case uint16_value:
        local_210 = typed_array_view::data(&in_RDI->data_);
        local_220[0]._vptr_ser_context = (_func_int **)0x0;
        ser_context::ser_context(local_220);
        basic_json_visitor<char>::typed_array<unsigned_short_const>
                  (in_stack_fffffffffffffb80,
                   (span<const_unsigned_short,_18446744073709551615UL> *)in_stack_fffffffffffffb78,
                   tag,in_stack_fffffffffffffb68);
        ser_context::~ser_context(local_220);
        break;
      case uint32_value:
        local_230 = typed_array_view::data(&in_RDI->data_);
        local_240[0]._vptr_ser_context = (_func_int **)0x0;
        ser_context::ser_context(local_240);
        basic_json_visitor<char>::typed_array<unsigned_int_const>
                  (in_stack_fffffffffffffb80,
                   (span<const_unsigned_int,_18446744073709551615UL> *)in_stack_fffffffffffffb78,tag
                   ,in_stack_fffffffffffffb68);
        ser_context::~ser_context(local_240);
        break;
      case uint64_value:
        local_250 = typed_array_view::data(&in_RDI->data_);
        local_260[0]._vptr_basic_json_visitor = (_func_int **)0x0;
        this_01 = local_260;
        ser_context::ser_context((ser_context *)this_01);
        basic_json_visitor<char>::typed_array<unsigned_long_const>
                  (this_01,(span<const_unsigned_long,_18446744073709551615UL> *)local_10,tag,
                   in_stack_fffffffffffffb68);
        ser_context::~ser_context((ser_context *)local_260);
        break;
      case int8_value:
        local_270 = typed_array_view::data(&in_RDI->data_);
        local_280[0]._vptr_ser_context = (_func_int **)0x0;
        this_00 = local_280;
        ser_context::ser_context(this_00);
        basic_json_visitor<char>::typed_array<signed_char_const>
                  (in_stack_fffffffffffffb80,
                   (span<const_signed_char,_18446744073709551615UL> *)in_stack_fffffffffffffb78,
                   (semantic_tag)((ulong)this_00 >> 0x38),(ser_context *)local_10);
        ser_context::~ser_context(local_280);
        break;
      case int16_value:
        local_290 = typed_array_view::data(&in_RDI->data_);
        local_2a0[0]._vptr_ser_context = (_func_int **)0x0;
        ser_context::ser_context(local_2a0);
        basic_json_visitor<char>::typed_array<short_const>
                  (in_stack_fffffffffffffb80,
                   (span<const_short,_18446744073709551615UL> *)in_stack_fffffffffffffb78,tag,
                   in_stack_fffffffffffffb68);
        ser_context::~ser_context(local_2a0);
        break;
      case int32_value:
        local_2b0 = typed_array_view::data(&in_RDI->data_);
        local_2c0[0]._vptr_ser_context = (_func_int **)0x0;
        ser_context::ser_context(local_2c0);
        basic_json_visitor<char>::typed_array<int_const>
                  (in_stack_fffffffffffffb80,
                   (span<const_int,_18446744073709551615UL> *)in_stack_fffffffffffffb78,tag,
                   in_stack_fffffffffffffb68);
        ser_context::~ser_context(local_2c0);
        break;
      case int64_value:
        local_2e0._16_16_ = (undefined1  [16])typed_array_view::data(&in_RDI->data_);
        local_2e0._0_8_ = (_func_int **)0x0;
        in_stack_fffffffffffffb40 = (typed_array_view *)local_2e0;
        ser_context::ser_context((ser_context *)in_stack_fffffffffffffb40);
        basic_json_visitor<char>::typed_array<long_const>
                  (in_stack_fffffffffffffb80,
                   (span<const_long,_18446744073709551615UL> *)in_stack_fffffffffffffb78,tag,
                   in_stack_fffffffffffffb68);
        ser_context::~ser_context((ser_context *)local_2e0);
        in_stack_fffffffffffffb38 = local_10;
        break;
      default:
        break;
      case float_value:
        local_2f0 = typed_array_view::data(&in_RDI->data_);
        local_300[0]._vptr_ser_context = (_func_int **)0x0;
        ser_context::ser_context(local_300);
        basic_json_visitor<char>::typed_array<float_const>
                  (in_stack_fffffffffffffb80,
                   (span<const_float,_18446744073709551615UL> *)in_stack_fffffffffffffb78,tag,
                   in_stack_fffffffffffffb68);
        ser_context::~ser_context(local_300);
        break;
      case double_value:
        local_320._16_16_ = (undefined1  [16])typed_array_view::data(&in_RDI->data_);
        local_320._0_8_ = (_func_int **)0x0;
        in_stack_fffffffffffffb20 = (typed_array_view *)local_320;
        ser_context::ser_context((ser_context *)in_stack_fffffffffffffb20);
        basic_json_visitor<char>::typed_array<double_const>
                  (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,tag,in_stack_fffffffffffffb68
                  );
        ser_context::~ser_context((ser_context *)local_320);
      }
      in_RDI->state_ = 0;
      typed_array_view::typed_array_view(in_stack_fffffffffffffb20);
      typed_array_view::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    }
    else {
      event(in_RDI);
      basic_staj_event<char>::send_json_event
                (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                 in_stack_fffffffffffffbd8);
      local_28 = typed_array_view::size(&in_RDI->data_);
      tVar2 = typed_array_view::type(&in_RDI->data_);
      switch(tVar2) {
      case uint8_value:
        for (local_30 = in_RDI->index_; local_30 < local_28; local_30 = local_30 + 1) {
          local_40 = typed_array_view::data(&in_RDI->data_);
          detail::span<const_unsigned_char,_18446744073709551615UL>::operator[](&local_40,local_30);
          local_50[0]._vptr_ser_context = (_func_int **)0x0;
          ser_context::ser_context(local_50);
          basic_json_visitor<char>::uint64_value
                    (in_stack_fffffffffffffb80,(uint64_t)in_stack_fffffffffffffb78,
                     (semantic_tag)((ulong)in_stack_fffffffffffffb70 >> 0x38),
                     in_stack_fffffffffffffb68);
          ser_context::~ser_context(local_50);
        }
        break;
      case uint16_value:
        for (local_68 = in_RDI->index_; local_68 < local_28; local_68 = local_68 + 1) {
          local_78 = typed_array_view::data(&in_RDI->data_);
          detail::span<const_unsigned_short,_18446744073709551615UL>::operator[](&local_78,local_68)
          ;
          local_88[0]._vptr_ser_context = (_func_int **)0x0;
          ser_context::ser_context(local_88);
          basic_json_visitor<char>::uint64_value
                    (in_stack_fffffffffffffb80,(uint64_t)in_stack_fffffffffffffb78,
                     (semantic_tag)((ulong)in_stack_fffffffffffffb70 >> 0x38),
                     in_stack_fffffffffffffb68);
          ser_context::~ser_context(local_88);
        }
        break;
      case uint32_value:
        for (local_90 = in_RDI->index_; local_90 < local_28; local_90 = local_90 + 1) {
          local_a0 = typed_array_view::data(&in_RDI->data_);
          detail::span<const_unsigned_int,_18446744073709551615UL>::operator[](&local_a0,local_90);
          local_b0[0]._vptr_ser_context = (_func_int **)0x0;
          ser_context::ser_context(local_b0);
          basic_json_visitor<char>::uint64_value
                    (in_stack_fffffffffffffb80,(uint64_t)in_stack_fffffffffffffb78,
                     (semantic_tag)((ulong)in_stack_fffffffffffffb70 >> 0x38),
                     in_stack_fffffffffffffb68);
          ser_context::~ser_context(local_b0);
        }
        break;
      case uint64_value:
        for (local_b8 = in_RDI->index_; local_b8 < local_28; local_b8 = local_b8 + 1) {
          local_c8 = typed_array_view::data(&in_RDI->data_);
          detail::span<const_unsigned_long,_18446744073709551615UL>::operator[](&local_c8,local_b8);
          local_d8[0]._vptr_ser_context = (_func_int **)0x0;
          ser_context::ser_context(local_d8);
          basic_json_visitor<char>::uint64_value
                    (in_stack_fffffffffffffb80,(uint64_t)in_stack_fffffffffffffb78,
                     (semantic_tag)((ulong)in_stack_fffffffffffffb70 >> 0x38),
                     in_stack_fffffffffffffb68);
          ser_context::~ser_context(local_d8);
        }
        break;
      case int8_value:
        for (local_e0 = in_RDI->index_; local_e0 < local_28; local_e0 = local_e0 + 1) {
          local_f0 = typed_array_view::data(&in_RDI->data_);
          detail::span<const_signed_char,_18446744073709551615UL>::operator[](&local_f0,local_e0);
          local_100[0]._vptr_ser_context = (_func_int **)0x0;
          ser_context::ser_context(local_100);
          basic_json_visitor<char>::int64_value
                    (in_stack_fffffffffffffb80,(int64_t)in_stack_fffffffffffffb78,
                     (semantic_tag)((ulong)in_stack_fffffffffffffb70 >> 0x38),
                     in_stack_fffffffffffffb68);
          ser_context::~ser_context(local_100);
        }
        break;
      case int16_value:
        for (local_108 = in_RDI->index_; local_108 < local_28; local_108 = local_108 + 1) {
          local_118 = typed_array_view::data(&in_RDI->data_);
          detail::span<const_short,_18446744073709551615UL>::operator[](&local_118,local_108);
          local_128[0]._vptr_ser_context = (_func_int **)0x0;
          ser_context::ser_context(local_128);
          basic_json_visitor<char>::int64_value
                    (in_stack_fffffffffffffb80,(int64_t)in_stack_fffffffffffffb78,
                     (semantic_tag)((ulong)in_stack_fffffffffffffb70 >> 0x38),
                     in_stack_fffffffffffffb68);
          ser_context::~ser_context(local_128);
        }
        break;
      case int32_value:
        for (local_130 = in_RDI->index_; local_130 < local_28; local_130 = local_130 + 1) {
          local_140 = typed_array_view::data(&in_RDI->data_);
          detail::span<const_int,_18446744073709551615UL>::operator[](&local_140,local_130);
          local_150[0]._vptr_ser_context = (_func_int **)0x0;
          ser_context::ser_context(local_150);
          basic_json_visitor<char>::int64_value
                    (in_stack_fffffffffffffb80,(int64_t)in_stack_fffffffffffffb78,
                     (semantic_tag)((ulong)in_stack_fffffffffffffb70 >> 0x38),
                     in_stack_fffffffffffffb68);
          ser_context::~ser_context(local_150);
        }
        break;
      case int64_value:
        for (local_158 = in_RDI->index_; local_158 < local_28; local_158 = local_158 + 1) {
          local_168 = typed_array_view::data(&in_RDI->data_);
          detail::span<const_long,_18446744073709551615UL>::operator[](&local_168,local_158);
          local_178[0]._vptr_ser_context = (_func_int **)0x0;
          ser_context::ser_context(local_178);
          basic_json_visitor<char>::int64_value
                    (in_stack_fffffffffffffb80,(int64_t)in_stack_fffffffffffffb78,
                     (semantic_tag)((ulong)in_stack_fffffffffffffb70 >> 0x38),
                     in_stack_fffffffffffffb68);
          ser_context::~ser_context(local_178);
        }
        break;
      default:
        break;
      case float_value:
        for (local_180 = in_RDI->index_; local_180 < local_28; local_180 = local_180 + 1) {
          local_190 = typed_array_view::data(&in_RDI->data_);
          detail::span<const_float,_18446744073709551615UL>::operator[](&local_190,local_180);
          local_1a0[0]._vptr_ser_context = (_func_int **)0x0;
          ser_context::ser_context(local_1a0);
          basic_json_visitor<char>::double_value
                    (in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78,
                     (semantic_tag)((ulong)in_stack_fffffffffffffb70 >> 0x38),
                     in_stack_fffffffffffffb68);
          ser_context::~ser_context(local_1a0);
        }
        break;
      case double_value:
        for (local_1a8 = in_RDI->index_; local_1a8 < local_28; local_1a8 = local_1a8 + 1) {
          local_1b8 = typed_array_view::data(&in_RDI->data_);
          detail::span<const_double,_18446744073709551615UL>::operator[](&local_1b8,local_1a8);
          local_1c8[0]._vptr_ser_context = (_func_int **)0x0;
          ser_context::ser_context(local_1c8);
          basic_json_visitor<char>::double_value
                    (in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78,
                     (semantic_tag)((ulong)in_stack_fffffffffffffb70 >> 0x38),
                     in_stack_fffffffffffffb68);
          ser_context::~ser_context(local_1c8);
        }
      }
      in_RDI->state_ = 0;
      typed_array_view::typed_array_view(in_stack_fffffffffffffb20);
      typed_array_view::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      in_RDI->index_ = 0;
    }
  }
  else {
    event(in_RDI);
    basic_staj_event<char>::send_json_event
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
               in_stack_fffffffffffffbd8);
  }
  return;
}

Assistant:

void dump(basic_json_visitor<CharT>& visitor, const ser_context& context, std::error_code& ec)
    {
        if (is_typed_array())
        {
            if (index_ != 0)
            {
                event().send_json_event(visitor, context, ec);
                const std::size_t len = data_.size();
                switch (data_.type())
                {
                    case typed_array_type::uint8_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.uint64_value(data_.data(uint8_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::uint16_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.uint64_value(data_.data(uint16_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::uint32_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.uint64_value(data_.data(uint32_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::uint64_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.uint64_value(data_.data(uint64_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::int8_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.int64_value(data_.data(int8_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::int16_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.int64_value(data_.data(int16_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::int32_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.int64_value(data_.data(int32_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::int64_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.int64_value(data_.data(int64_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::float_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.double_value(data_.data(float_array_arg)[i]);
                        }
                        break;
                    }
                    case typed_array_type::double_value:
                    {
                        for (auto i = index_; i < len; ++i) 
                        {
                            visitor.double_value(data_.data(double_array_arg)[i]);
                        }
                        break;
                    }
                    default:
                        break;
                }
                
                state_ = staj_cursor_state();
                data_ = typed_array_view();
                index_ = 0;
            }
            else
            {
                switch (data_.type())
                {
                    case typed_array_type::uint8_value:
                    {
                        visitor.typed_array(data_.data(uint8_array_arg));
                        break;
                    }
                    case typed_array_type::uint16_value:
                    {
                        visitor.typed_array(data_.data(uint16_array_arg));
                        break;
                    }
                    case typed_array_type::uint32_value:
                    {
                        visitor.typed_array(data_.data(uint32_array_arg));
                        break;
                    }
                    case typed_array_type::uint64_value:
                    {
                        visitor.typed_array(data_.data(uint64_array_arg));
                        break;
                    }
                    case typed_array_type::int8_value:
                    {
                        visitor.typed_array(data_.data(int8_array_arg));
                        break;
                    }
                    case typed_array_type::int16_value:
                    {
                        visitor.typed_array(data_.data(int16_array_arg));
                        break;
                    }
                    case typed_array_type::int32_value:
                    {
                        visitor.typed_array(data_.data(int32_array_arg));
                        break;
                    }
                    case typed_array_type::int64_value:
                    {
                        visitor.typed_array(data_.data(int64_array_arg));
                        break;
                    }
                    case typed_array_type::float_value:
                    {
                        visitor.typed_array(data_.data(float_array_arg));
                        break;
                    }
                    case typed_array_type::double_value:
                    {
                        visitor.typed_array(data_.data(double_array_arg));
                        break;
                    }
                    default:
                        break;
                }

                state_ = staj_cursor_state();
                data_ = typed_array_view();
            }
        }
        else
        {
            event().send_json_event(visitor, context, ec);
        }
    }